

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O3

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy
               (string *tgtName,cmMessenger *messenger,cmListFileBacktrace *context)

{
  PolicyStatus PVar1;
  size_t sVar2;
  ostream *poVar3;
  PolicyID id;
  bool bVar4;
  MessageType t;
  char *__s;
  ostringstream e;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1c8._16_8_ = (context->Bottom).Position.Position;
  local_1c8._0_8_ = (context->Bottom).State;
  local_1c8._8_8_ = (context->Bottom).Position.Tree;
  PVar1 = cmStateSnapshot::GetPolicy((cmStateSnapshot *)local_1c8,CMP0026);
  if (PVar1 - NEW < 3) {
    t = FATAL_ERROR;
    __s = "may";
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (PVar1 != WARN) goto LAB_0039fc5a;
    cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1c8,(cmPolicies *)0x1a,id);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1c8._0_8_,local_1c8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((cmState *)local_1c8._0_8_ != (cmState *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    t = AUTHOR_WARNING;
    bVar4 = true;
    __s = "should";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"The LOCATION property ",0x16);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8," not be read from target \"",0x1a);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(tgtName->_M_dataplus)._M_p,tgtName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "\".  Use the target name directly with add_custom_command, or use the generator expression $<TARGET_FILE>, as appropriate.\n"
             ,0x7a);
  std::__cxx11::stringbuf::str();
  cmMessenger::IssueMessage(messenger,t,(string *)local_1c8,context);
  if ((cmState *)local_1c8._0_8_ != (cmState *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
LAB_0039fc5a:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return bVar4;
}

Assistant:

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy(
  std::string const& tgtName, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  std::ostringstream e;
  const char* modal = CM_NULLPTR;
  cmake::MessageType messageType = cmake::AUTHOR_WARNING;
  switch (context.GetBottom().GetPolicy(cmPolicies::CMP0026)) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0026) << "\n";
      modal = "should";
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      modal = "may";
      messageType = cmake::FATAL_ERROR;
  }

  if (modal) {
    e << "The LOCATION property " << modal << " not be read from target \""
      << tgtName
      << "\".  Use the target name directly with "
         "add_custom_command, or use the generator expression $<TARGET_FILE>, "
         "as appropriate.\n";
    messenger->IssueMessage(messageType, e.str(), context);
  }

  return messageType != cmake::FATAL_ERROR;
}